

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::PopStyleColor(int count)

{
  float fVar1;
  ImPlotContext *pIVar2;
  ImGuiColorMod *pIVar3;
  ImVec4 *pIVar4;
  ImGuiColorMod *backup;
  ImPlotContext *gp;
  int count_local;
  
  pIVar2 = GImPlot;
  gp._4_4_ = count;
  if (count <= (GImPlot->ColorModifiers).Size) {
    for (; 0 < gp._4_4_; gp._4_4_ = gp._4_4_ + -1) {
      pIVar3 = ImVector<ImGuiColorMod>::back(&pIVar2->ColorModifiers);
      pIVar4 = (pIVar2->Style).Colors + pIVar3->Col;
      fVar1 = (pIVar3->BackupValue).y;
      pIVar4->x = (pIVar3->BackupValue).x;
      pIVar4->y = fVar1;
      fVar1 = (pIVar3->BackupValue).w;
      pIVar4->z = (pIVar3->BackupValue).z;
      pIVar4->w = fVar1;
      ImVector<ImGuiColorMod>::pop_back(&pIVar2->ColorModifiers);
    }
    return;
  }
  __assert_fail("(count <= gp.ColorModifiers.Size) && \"You can\'t pop more modifiers than have been pushed!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xca5,"void ImPlot::PopStyleColor(int)");
}

Assistant:

void PopStyleColor(int count) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(count <= gp.ColorModifiers.Size, "You can't pop more modifiers than have been pushed!");
    while (count > 0)
    {
        ImGuiColorMod& backup = gp.ColorModifiers.back();
        gp.Style.Colors[backup.Col] = backup.BackupValue;
        gp.ColorModifiers.pop_back();
        count--;
    }
}